

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O1

void finish(gdmf *d)

{
  float *__ptr;
  
  __ptr = (d->scalars)._begin;
  if (__ptr != (float *)0x0) {
    free(__ptr);
  }
  (d->scalars)._begin = (float *)0x0;
  (d->scalars)._end = (float *)0x0;
  (d->scalars).end_array = (float *)0x0;
  return;
}

Assistant:

void finish(gdmf& d) { d.scalars.delete_v(); }